

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

void __thiscall
UnicodeFullTest_findi_Test<std::pair<char,_char8_t>_>::TestBody
          (UnicodeFullTest_findi_Test<std::pair<char,_char8_t>_> *this)

{
  bool bVar1;
  char *pcVar2;
  char32_t (*in_RDX) [5];
  char32_t (*in_string) [1];
  char32_t (*in_string_00) [2];
  char32_t (*in_string_01) [2];
  char32_t (*in_string_02) [2];
  char32_t (*in_string_03) [2];
  char32_t (*in_string_04) [2];
  char32_t (*in_string_05) [2];
  char32_t (*in_string_06) [2];
  char32_t (*in_string_07) [2];
  char32_t (*in_string_08) [2];
  char32_t (*in_string_09) [2];
  char32_t (*in_string_10) [3];
  char32_t (*in_string_11) [3];
  char32_t (*in_string_12) [3];
  char32_t (*in_string_13) [3];
  char32_t (*in_string_14) [3];
  char32_t (*in_string_15) [3];
  char32_t (*in_string_16) [3];
  char32_t (*in_string_17) [3];
  char32_t (*in_string_18) [9];
  char32_t (*in_string_19) [2];
  char32_t (*in_string_20) [2];
  char32_t (*in_string_21) [2];
  char32_t (*in_string_22) [2];
  char32_t (*in_string_23) [2];
  char32_t (*in_string_24) [2];
  char32_t (*in_string_25) [2];
  char32_t (*in_string_26) [2];
  char32_t (*in_string_27) [2];
  char32_t (*in_string_28) [2];
  char32_t (*in_string_29) [3];
  char32_t (*in_string_30) [3];
  char32_t (*in_string_31) [3];
  char32_t (*in_string_32) [3];
  char32_t (*in_string_33) [3];
  char32_t (*in_string_34) [3];
  char32_t (*in_string_35) [3];
  char32_t (*in_string_36) [3];
  char32_t (*in_string_37) [3];
  char32_t (*in_string_38) [3];
  char32_t (*in_string_39) [3];
  char32_t (*in_string_40) [3];
  char32_t (*in_string_41) [3];
  char32_t (*in_string_42) [3];
  char32_t (*in_string_43) [3];
  char32_t (*in_string_44) [3];
  AssertHelper local_e28 [8];
  Message local_e20 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_e18;
  size_t local_df8;
  undefined1 local_df0 [8];
  AssertionResult gtest_ar_44;
  Message local_dd8 [12];
  int local_dcc;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_dc8;
  size_t local_da8;
  undefined1 local_da0 [8];
  AssertionResult gtest_ar_43;
  Message local_d88 [12];
  int local_d7c;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_d78;
  size_t local_d58;
  undefined1 local_d50 [8];
  AssertionResult gtest_ar_42;
  Message local_d38 [12];
  int local_d2c;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_d28;
  size_t local_d08;
  undefined1 local_d00 [8];
  AssertionResult gtest_ar_41;
  Message local_ce8 [12];
  int local_cdc;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_cd8;
  size_t local_cb8;
  undefined1 local_cb0 [8];
  AssertionResult gtest_ar_40;
  Message local_c98 [12];
  int local_c8c;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_c88;
  size_t local_c68;
  undefined1 local_c60 [8];
  AssertionResult gtest_ar_39;
  Message local_c48 [12];
  int local_c3c;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_c38;
  size_t local_c18;
  undefined1 local_c10 [8];
  AssertionResult gtest_ar_38;
  Message local_bf8 [12];
  int local_bec;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_be8;
  size_t local_bc8;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar_37;
  Message local_ba8 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_ba0;
  size_t local_b80;
  undefined1 local_b78 [8];
  AssertionResult gtest_ar_36;
  Message local_b60 [12];
  int local_b54;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_b50;
  size_t local_b30;
  undefined1 local_b28 [8];
  AssertionResult gtest_ar_35;
  Message local_b10 [12];
  int local_b04;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_b00;
  size_t local_ae0;
  undefined1 local_ad8 [8];
  AssertionResult gtest_ar_34;
  Message local_ac0 [12];
  int local_ab4;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_ab0;
  size_t local_a90;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar_33;
  Message local_a70 [12];
  int local_a64;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_a60;
  size_t local_a40;
  undefined1 local_a38 [8];
  AssertionResult gtest_ar_32;
  Message local_a20 [12];
  int local_a14;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_a10;
  size_t local_9f0;
  undefined1 local_9e8 [8];
  AssertionResult gtest_ar_31;
  Message local_9d0 [12];
  int local_9c4;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_9c0;
  size_t local_9a0;
  undefined1 local_998 [8];
  AssertionResult gtest_ar_30;
  Message local_980 [12];
  int local_974;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_970;
  size_t local_950;
  undefined1 local_948 [8];
  AssertionResult gtest_ar_29;
  Message local_930 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_928;
  size_t local_908;
  undefined1 local_900 [8];
  AssertionResult gtest_ar_28;
  Message local_8e8 [12];
  int local_8dc;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_8d8;
  size_t local_8b8;
  undefined1 local_8b0 [8];
  AssertionResult gtest_ar_27;
  Message local_898 [12];
  int local_88c;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_888;
  size_t local_868;
  undefined1 local_860 [8];
  AssertionResult gtest_ar_26;
  Message local_848 [12];
  int local_83c;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_838;
  size_t local_818;
  undefined1 local_810 [8];
  AssertionResult gtest_ar_25;
  Message local_7f8 [12];
  int local_7ec;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_7e8;
  size_t local_7c8;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar_24;
  Message local_7a8 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_7a0;
  size_t local_780;
  undefined1 local_778 [8];
  AssertionResult gtest_ar_23;
  Message local_760 [12];
  int local_754;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_750;
  size_t local_730;
  undefined1 local_728 [8];
  AssertionResult gtest_ar_22;
  Message local_710 [12];
  int local_704;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_700;
  size_t local_6e0;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_21;
  Message local_6c0 [12];
  int local_6b4;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_6b0;
  size_t local_690;
  undefined1 local_688 [8];
  AssertionResult gtest_ar_20;
  Message local_670 [12];
  int local_664;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_660;
  size_t local_640;
  undefined1 local_638 [8];
  AssertionResult gtest_ar_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> double_abcd_str;
  Message local_600 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_5f8;
  size_t local_5d8;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_18;
  Message local_5b8 [12];
  int local_5ac;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_5a8;
  size_t local_588;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_17;
  Message local_568 [12];
  int local_55c;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_558;
  size_t local_538;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_16;
  Message local_518 [12];
  int local_50c;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_508;
  size_t local_4e8;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_15;
  Message local_4c8 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_4c0;
  size_t local_4a0;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_14;
  Message local_480 [12];
  int local_474;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_470;
  size_t local_450;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_13;
  Message local_430 [12];
  int local_424;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_420;
  size_t local_400;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_12;
  Message local_3e0 [12];
  int local_3d4;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_3d0;
  size_t local_3b0;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_11;
  Message local_390 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_388;
  size_t local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_10;
  Message local_348 [12];
  int local_33c;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_338;
  size_t local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_9;
  Message local_2f8 [12];
  int local_2ec;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_2e8;
  size_t local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_8;
  Message local_2a8 [12];
  int local_29c;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_298;
  size_t local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_7;
  Message local_258 [12];
  int local_24c;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_248;
  size_t local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_6;
  Message local_208 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_200;
  size_t local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_5;
  Message local_1c0 [12];
  int local_1b4;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_1b0;
  size_t local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_4;
  Message local_170 [12];
  int local_164;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_160;
  size_t local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_3;
  Message local_120 [12];
  int local_114;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_110;
  size_t local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_2;
  Message local_d0 [12];
  int local_c4;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_c0;
  size_t local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [8];
  int local_78 [4];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_68;
  size_t local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abcd_str;
  UnicodeFullTest_findi_Test<std::pair<char,_char8_t>_> *this_local;
  
  jessilib::string_cast<char,char32_t[5]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(jessilib *)L"ABCD",in_RDX);
  jessilib::string_cast<char8_t,char32_t[1]>(&local_68,(jessilib *)0x692abc,in_string);
  local_48 = jessilib::findi<char,char8_t>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_,&local_68);
  local_78[0] = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_40,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"\"))","0",
             &local_48,local_78);
  std::__cxx11::u8string::~u8string((u8string *)&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x14d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_c0,(jessilib *)0x697ba4,in_string_00);
  local_a0 = jessilib::findi<char,char8_t>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_,&local_c0);
  local_c4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"A\"))","0",
             &local_a0,&local_c4);
  std::__cxx11::u8string::~u8string((u8string *)&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x150,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_110,(jessilib *)0x697b5c,in_string_01);
  local_f0 = jessilib::findi<char,char8_t>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_,&local_110);
  local_114 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_e8,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"B\"))","1",
             &local_f0,&local_114);
  std::__cxx11::u8string::~u8string((u8string *)&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x151,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_160,(jessilib *)0x697b68,in_string_02);
  local_140 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_160);
  local_164 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_138,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"C\"))","2",
             &local_140,&local_164);
  std::__cxx11::u8string::~u8string((u8string *)&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x152,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_1b0,(jessilib *)0x697a08,in_string_03);
  local_190 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_1b0);
  local_1b4 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_188,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"D\"))","3",
             &local_190,&local_1b4);
  std::__cxx11::u8string::~u8string((u8string *)&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x153,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_200,(jessilib *)L"E",in_string_04);
  local_1e0 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_200);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1d8,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"E\"))",
             "decltype(abcd_str)::npos",&local_1e0,&std::__cxx11::string::npos);
  std::__cxx11::u8string::~u8string((u8string *)&local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x154,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_248,(jessilib *)0x697bec,in_string_05);
  local_228 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_248);
  local_24c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_220,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"a\"))","0",
             &local_228,&local_24c);
  std::__cxx11::u8string::~u8string((u8string *)&local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x155,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_298,(jessilib *)0x697bc8,in_string_06);
  local_278 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_298);
  local_29c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_270,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"b\"))","1",
             &local_278,&local_29c);
  std::__cxx11::u8string::~u8string((u8string *)&local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x156,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_2e8,(jessilib *)0x697bd4,in_string_07);
  local_2c8 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_2e8);
  local_2ec = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2c0,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"c\"))","2",
             &local_2c8,&local_2ec);
  std::__cxx11::u8string::~u8string((u8string *)&local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x157,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_338,(jessilib *)0x697a30,in_string_08);
  local_318 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_338);
  local_33c = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_310,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"d\"))","3",
             &local_318,&local_33c);
  std::__cxx11::u8string::~u8string((u8string *)&local_338);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(local_348);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x158,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_388,(jessilib *)0x69c374,in_string_09);
  local_368 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_388);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_360,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"e\"))",
             "decltype(abcd_str)::npos",&local_368,&std::__cxx11::string::npos);
  std::__cxx11::u8string::~u8string((u8string *)&local_388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(local_390);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x159,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_3d0,(jessilib *)L"AB",in_string_10);
  local_3b0 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_3d0);
  local_3d4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3a8,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"AB\"))","0",
             &local_3b0,&local_3d4);
  std::__cxx11::u8string::~u8string((u8string *)&local_3d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(local_3e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x15c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_420,(jessilib *)L"BC",in_string_11);
  local_400 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_420);
  local_424 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3f8,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"BC\"))","1",
             &local_400,&local_424);
  std::__cxx11::u8string::~u8string((u8string *)&local_420);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(local_430);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x15d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_470,(jessilib *)0x697a04,in_string_12);
  local_450 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_470);
  local_474 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_448,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"CD\"))","2",
             &local_450,&local_474);
  std::__cxx11::u8string::~u8string((u8string *)&local_470);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(local_480);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x15e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_4c0,(jessilib *)L"DA",in_string_13);
  local_4a0 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_4c0);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_498,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"DA\"))",
             "decltype(abcd_str)::npos",&local_4a0,&std::__cxx11::string::npos);
  std::__cxx11::u8string::~u8string((u8string *)&local_4c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(local_4c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x15f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_508,(jessilib *)L"ab",in_string_14);
  local_4e8 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_508);
  local_50c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_4e0,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"ab\"))","0",
             &local_4e8,&local_50c);
  std::__cxx11::u8string::~u8string((u8string *)&local_508);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(local_518);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x160,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_558,(jessilib *)L"bc",in_string_15);
  local_538 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_558);
  local_55c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_530,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"bc\"))","1",
             &local_538,&local_55c);
  std::__cxx11::u8string::~u8string((u8string *)&local_558);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar1) {
    testing::Message::Message(local_568);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x161,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_5a8,(jessilib *)0x697a2c,in_string_16);
  local_588 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_5a8);
  local_5ac = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_580,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"cd\"))","2",
             &local_588,&local_5ac);
  std::__cxx11::u8string::~u8string((u8string *)&local_5a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar1) {
    testing::Message::Message(local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x162,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_5f8,(jessilib *)L"da",in_string_17);
  local_5d8 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar.message_,&local_5f8);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_5d0,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"da\"))",
             "decltype(abcd_str)::npos",&local_5d8,&std::__cxx11::string::npos);
  std::__cxx11::u8string::~u8string((u8string *)&local_5f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(local_600);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(double_abcd_str.field_2._M_local_buf + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x163,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(double_abcd_str.field_2._M_local_buf + 8),local_600);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)(double_abcd_str.field_2._M_local_buf + 8));
    testing::Message::~Message(local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  jessilib::string_cast<char,char32_t[9]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_19.message_,(jessilib *)L"AABBCCDD",in_string_18);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_660,(jessilib *)0x697ba4,in_string_19);
  local_640 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_660);
  local_664 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_638,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"A\"))"
             ,"0",&local_640,&local_664);
  std::__cxx11::u8string::~u8string((u8string *)&local_660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar1) {
    testing::Message::Message(local_670);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_638);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x168,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,local_670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_6b0,(jessilib *)0x697b5c,in_string_20);
  local_690 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_6b0);
  local_6b4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_688,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"B\"))"
             ,"2",&local_690,&local_6b4);
  std::__cxx11::u8string::~u8string((u8string *)&local_6b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar1) {
    testing::Message::Message(local_6c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_688);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x169,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,local_6c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_700,(jessilib *)0x697b68,in_string_21);
  local_6e0 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_700);
  local_704 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_6d8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"C\"))"
             ,"4",&local_6e0,&local_704);
  std::__cxx11::u8string::~u8string((u8string *)&local_700);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar1) {
    testing::Message::Message(local_710);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x16a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,local_710);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(local_710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_750,(jessilib *)0x697a08,in_string_22);
  local_730 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_750);
  local_754 = 6;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_728,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"D\"))"
             ,"6",&local_730,&local_754);
  std::__cxx11::u8string::~u8string((u8string *)&local_750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_728);
  if (!bVar1) {
    testing::Message::Message(local_760);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_728);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x16b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,local_760);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(local_760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_728);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_7a0,(jessilib *)L"E",in_string_23);
  local_780 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_7a0);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_778,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"E\"))"
             ,"decltype(double_abcd_str)::npos",&local_780,&std::__cxx11::string::npos);
  std::__cxx11::u8string::~u8string((u8string *)&local_7a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
  if (!bVar1) {
    testing::Message::Message(local_7a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x16c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,local_7a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_7e8,(jessilib *)0x697bec,in_string_24);
  local_7c8 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_7e8);
  local_7ec = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_7c0,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"a\"))"
             ,"0",&local_7c8,&local_7ec);
  std::__cxx11::u8string::~u8string((u8string *)&local_7e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar1) {
    testing::Message::Message(local_7f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x16d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(local_7f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_838,(jessilib *)0x697bc8,in_string_25);
  local_818 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_838);
  local_83c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_810,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"b\"))"
             ,"2",&local_818,&local_83c);
  std::__cxx11::u8string::~u8string((u8string *)&local_838);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
  if (!bVar1) {
    testing::Message::Message(local_848);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_810);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x16e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,local_848);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(local_848);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_810);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_888,(jessilib *)0x697bd4,in_string_26);
  local_868 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_888);
  local_88c = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_860,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"c\"))"
             ,"4",&local_868,&local_88c);
  std::__cxx11::u8string::~u8string((u8string *)&local_888);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_860);
  if (!bVar1) {
    testing::Message::Message(local_898);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_860);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x16f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,local_898);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(local_898);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_860);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_8d8,(jessilib *)0x697a30,in_string_27);
  local_8b8 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_8d8);
  local_8dc = 6;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_8b0,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"d\"))"
             ,"6",&local_8b8,&local_8dc);
  std::__cxx11::u8string::~u8string((u8string *)&local_8d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b0);
  if (!bVar1) {
    testing::Message::Message(local_8e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x170,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,local_8e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(local_8e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b0);
  jessilib::string_cast<char8_t,char32_t[2]>(&local_928,(jessilib *)0x69c374,in_string_28);
  local_908 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_928);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_900,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"e\"))"
             ,"decltype(double_abcd_str)::npos",&local_908,&std::__cxx11::string::npos);
  std::__cxx11::u8string::~u8string((u8string *)&local_928);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_900);
  if (!bVar1) {
    testing::Message::Message(local_930);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_900);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x171,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,local_930);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(local_930);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_900);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_970,(jessilib *)L"AA",in_string_29);
  local_950 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_970);
  local_974 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_948,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"AA\"))"
             ,"0",&local_950,&local_974);
  std::__cxx11::u8string::~u8string((u8string *)&local_970);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_948);
  if (!bVar1) {
    testing::Message::Message(local_980);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_948);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x174,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,local_980);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(local_980);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_948);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_9c0,(jessilib *)L"AB",in_string_30);
  local_9a0 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_9c0);
  local_9c4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_998,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"AB\"))"
             ,"1",&local_9a0,&local_9c4);
  std::__cxx11::u8string::~u8string((u8string *)&local_9c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_998);
  if (!bVar1) {
    testing::Message::Message(local_9d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_998);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x175,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,local_9d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(local_9d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_998);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_a10,(jessilib *)L"BB",in_string_31);
  local_9f0 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_a10);
  local_a14 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_9e8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"BB\"))"
             ,"2",&local_9f0,&local_a14);
  std::__cxx11::u8string::~u8string((u8string *)&local_a10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e8);
  if (!bVar1) {
    testing::Message::Message(local_a20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x176,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,local_a20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(local_a20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e8);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_a60,(jessilib *)L"BC",in_string_32);
  local_a40 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_a60);
  local_a64 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_a38,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"BC\"))"
             ,"3",&local_a40,&local_a64);
  std::__cxx11::u8string::~u8string((u8string *)&local_a60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a38);
  if (!bVar1) {
    testing::Message::Message(local_a70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x177,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,local_a70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(local_a70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a38);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_ab0,(jessilib *)L"CC",in_string_33);
  local_a90 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_ab0);
  local_ab4 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_a88,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"CC\"))"
             ,"4",&local_a90,&local_ab4);
  std::__cxx11::u8string::~u8string((u8string *)&local_ab0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
  if (!bVar1) {
    testing::Message::Message(local_ac0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x178,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,local_ac0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(local_ac0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_b00,(jessilib *)0x697a04,in_string_34);
  local_ae0 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_b00);
  local_b04 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_ad8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"CD\"))"
             ,"5",&local_ae0,&local_b04);
  std::__cxx11::u8string::~u8string((u8string *)&local_b00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad8);
  if (!bVar1) {
    testing::Message::Message(local_b10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ad8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x179,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,local_b10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(local_b10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad8);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_b50,(jessilib *)0x697b94,in_string_35);
  local_b30 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_b50);
  local_b54 = 6;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_b28,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"DD\"))"
             ,"6",&local_b30,&local_b54);
  std::__cxx11::u8string::~u8string((u8string *)&local_b50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b28);
  if (!bVar1) {
    testing::Message::Message(local_b60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x17a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,local_b60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(local_b60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b28);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_ba0,(jessilib *)L"DA",in_string_36);
  local_b80 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_ba0);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_b78,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"DA\"))"
             ,"decltype(double_abcd_str)::npos",&local_b80,&std::__cxx11::string::npos);
  std::__cxx11::u8string::~u8string((u8string *)&local_ba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b78);
  if (!bVar1) {
    testing::Message::Message(local_ba8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x17b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,local_ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b78);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_be8,(jessilib *)L"aa",in_string_37);
  local_bc8 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_be8);
  local_bec = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_bc0,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"aa\"))"
             ,"0",&local_bc8,&local_bec);
  std::__cxx11::u8string::~u8string((u8string *)&local_be8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar1) {
    testing::Message::Message(local_bf8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x17c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,local_bf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(local_bf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_c38,(jessilib *)L"ab",in_string_38);
  local_c18 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_c38);
  local_c3c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_c10,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"ab\"))"
             ,"1",&local_c18,&local_c3c);
  std::__cxx11::u8string::~u8string((u8string *)&local_c38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c10);
  if (!bVar1) {
    testing::Message::Message(local_c48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x17d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,local_c48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(local_c48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c10);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_c88,(jessilib *)L"bb",in_string_39);
  local_c68 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_c88);
  local_c8c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_c60,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"bb\"))"
             ,"2",&local_c68,&local_c8c);
  std::__cxx11::u8string::~u8string((u8string *)&local_c88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c60);
  if (!bVar1) {
    testing::Message::Message(local_c98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x17e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,local_c98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(local_c98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c60);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_cd8,(jessilib *)L"bc",in_string_40);
  local_cb8 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_cd8);
  local_cdc = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_cb0,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"bc\"))"
             ,"3",&local_cb8,&local_cdc);
  std::__cxx11::u8string::~u8string((u8string *)&local_cd8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb0);
  if (!bVar1) {
    testing::Message::Message(local_ce8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x17f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,local_ce8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(local_ce8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb0);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_d28,(jessilib *)L"cc",in_string_41);
  local_d08 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_d28);
  local_d2c = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_d00,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"cc\"))"
             ,"4",&local_d08,&local_d2c);
  std::__cxx11::u8string::~u8string((u8string *)&local_d28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d00);
  if (!bVar1) {
    testing::Message::Message(local_d38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x180,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_42.message_,local_d38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
    testing::Message::~Message(local_d38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d00);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_d78,(jessilib *)0x697a2c,in_string_42);
  local_d58 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_d78);
  local_d7c = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_d50,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"cd\"))"
             ,"5",&local_d58,&local_d7c);
  std::__cxx11::u8string::~u8string((u8string *)&local_d78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d50);
  if (!bVar1) {
    testing::Message::Message(local_d88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x181,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,local_d88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(local_d88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d50);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_dc8,(jessilib *)L"dd",in_string_43);
  local_da8 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_dc8);
  local_dcc = 6;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_da0,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"dd\"))"
             ,"6",&local_da8,&local_dcc);
  std::__cxx11::u8string::~u8string((u8string *)&local_dc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da0);
  if (!bVar1) {
    testing::Message::Message(local_dd8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_da0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x182,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,local_dd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(local_dd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_da0);
  jessilib::string_cast<char8_t,char32_t[3]>(&local_e18,(jessilib *)L"da",in_string_44);
  local_df8 = jessilib::findi<char,char8_t>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_19.message_,&local_e18);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_df0,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"da\"))"
             ,"decltype(double_abcd_str)::npos",&local_df8,&std::__cxx11::string::npos);
  std::__cxx11::u8string::~u8string((u8string *)&local_e18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_df0);
  if (!bVar1) {
    testing::Message::Message(local_e20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_df0);
    testing::internal::AssertHelper::AssertHelper
              (local_e28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x183,pcVar2);
    testing::internal::AssertHelper::operator=(local_e28,local_e20);
    testing::internal::AssertHelper::~AssertHelper(local_e28);
    testing::Message::~Message(local_e20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_df0);
  std::__cxx11::string::~string((string *)&gtest_ar_19.message_);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, findi) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");

	// Empty substring
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"")), 0);

	// Single-characters
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"A")), 0);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"B")), 1);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"C")), 2);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"D")), 3);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"E")), decltype(abcd_str)::npos);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"a")), 0);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"b")), 1);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"c")), 2);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"d")), 3);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"e")), decltype(abcd_str)::npos);

	// Two characters
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AB")), 0);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BC")), 1);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CD")), 2);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DA")), decltype(abcd_str)::npos);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"ab")), 0);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"bc")), 1);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"cd")), 2);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"da")), decltype(abcd_str)::npos);

	auto double_abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"AABBCCDD");

	// Single-characters
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"A")), 0);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"B")), 2);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"C")), 4);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"D")), 6);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"E")), decltype(double_abcd_str)::npos);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"a")), 0);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"b")), 2);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"c")), 4);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"d")), 6);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"e")), decltype(double_abcd_str)::npos);

	// Two characters
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AA")), 0);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AB")), 1);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BB")), 2);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BC")), 3);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CC")), 4);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CD")), 5);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DD")), 6);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DA")), decltype(double_abcd_str)::npos);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"aa")), 0);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"ab")), 1);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"bb")), 2);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"bc")), 3);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"cc")), 4);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"cd")), 5);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"dd")), 6);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"da")), decltype(double_abcd_str)::npos);
}